

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  int Fill;
  uint uVar5;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  int Fill_04;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  
  uVar8 = *(ulong *)pObj;
  uVar5 = (uint)uVar8;
  uVar6 = uVar5 & 0x1fffffff;
  uVar7 = (uint)(uVar8 >> 0x20) & 0x1fffffff;
  if (((-1 < (int)uVar5) && (uVar6 != 0x1fffffff)) && (uVar6 == uVar7)) {
    Gia_ObjSetBufLevel(p,pObj);
    return;
  }
  pGVar10 = p->pObjs;
  if ((pGVar10 <= pObj) && (pGVar4 = pGVar10 + p->nObjs, pObj < pGVar4)) {
    puVar3 = p->pMuxes;
    if ((puVar3 == (uint *)0x0) ||
       (iVar9 = (int)((ulong)((long)pObj - (long)pGVar10) >> 2), puVar3[iVar9 * -0x55555555] == 0))
    {
      bVar14 = (int)uVar5 < 0;
      uVar8 = uVar8 & 0x1fffffff;
      bVar13 = uVar8 == 0x1fffffff;
      iVar9 = (int)uVar8;
      if (uVar7 <= uVar6 || (bVar13 || bVar14)) {
        if (iVar9 == 0x1fffffff || (int)uVar5 < 0) {
          return;
        }
        if (bVar13 || bVar14) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x20e,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar1 = pObj + -uVar8;
        if ((pGVar10 <= pGVar1) && (pGVar1 < pGVar4)) {
          uVar5 = (int)((long)pGVar1 - (long)pGVar10 >> 2) * -0x55555555;
          pVVar11 = p->vLevels;
          Vec_IntFillExtra(pVVar11,uVar5 + 1,iVar9 * -3);
          if (((int)uVar5 < 0) || (pVVar11->nSize <= (int)uVar5)) goto LAB_0073e5f2;
          pGVar10 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
          pGVar4 = p->pObjs;
          if ((pGVar4 <= pGVar10) && (pGVar10 < pGVar4 + p->nObjs)) {
            iVar9 = pVVar11->pArray[uVar5 & 0x7fffffff];
            uVar5 = (int)((long)pGVar10 - (long)pGVar4 >> 2) * -0x55555555;
            pVVar11 = p->vLevels;
            Vec_IntFillExtra(pVVar11,uVar5 + 1,Fill_02);
            if (((int)uVar5 < 0) || (pVVar11->nSize <= (int)uVar5)) goto LAB_0073e5f2;
            pGVar10 = p->pObjs;
            if ((pGVar10 <= pObj) && (pObj < pGVar10 + p->nObjs)) {
              iVar12 = pVVar11->pArray[uVar5 & 0x7fffffff];
              uVar5 = (int)((long)pObj - (long)pGVar10 >> 2) * -0x55555555;
              pVVar11 = p->vLevels;
              Vec_IntFillExtra(pVVar11,uVar5 + 1,Fill_03);
              if (((int)uVar5 < 0) || (pVVar11->nSize <= (int)uVar5)) goto LAB_0073e611;
              if (iVar12 < iVar9) {
                iVar12 = iVar9;
              }
              iVar12 = iVar12 + 1;
LAB_0073e4dc:
              pVVar11->pArray[uVar5 & 0x7fffffff] = iVar12;
              return;
            }
          }
        }
      }
      else {
        if (bVar13 || bVar14) {
          __assert_fail("Gia_ObjIsXor(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x20f,"void Gia_ObjSetXorLevel(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar1 = pObj + -uVar8;
        if ((pGVar10 <= pGVar1) && (pGVar1 < pGVar4)) {
          uVar5 = (int)((long)pGVar1 - (long)pGVar10 >> 2) * -0x55555555;
          pVVar11 = p->vLevels;
          Vec_IntFillExtra(pVVar11,uVar5 + 1,iVar9 * -3);
          if (((int)uVar5 < 0) || (pVVar11->nSize <= (int)uVar5)) goto LAB_0073e5f2;
          pGVar10 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
          pGVar4 = p->pObjs;
          if ((pGVar4 <= pGVar10) && (pGVar10 < pGVar4 + p->nObjs)) {
            iVar9 = pVVar11->pArray[uVar5 & 0x7fffffff];
            uVar5 = (int)((long)pGVar10 - (long)pGVar4 >> 2) * -0x55555555;
            pVVar11 = p->vLevels;
            Vec_IntFillExtra(pVVar11,uVar5 + 1,Fill_00);
            if (((int)uVar5 < 0) || (pVVar11->nSize <= (int)uVar5)) goto LAB_0073e5f2;
            pGVar10 = p->pObjs;
            if ((pGVar10 <= pObj) && (pObj < pGVar10 + p->nObjs)) {
              iVar12 = pVVar11->pArray[uVar5 & 0x7fffffff];
              uVar5 = (int)((long)pObj - (long)pGVar10 >> 2) * -0x55555555;
              pVVar11 = p->vLevels;
              Vec_IntFillExtra(pVVar11,uVar5 + 1,Fill_01);
              if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar11->nSize)) {
                if (iVar12 < iVar9) {
                  iVar12 = iVar9;
                }
                iVar12 = iVar12 + 2;
                goto LAB_0073e4dc;
              }
LAB_0073e611:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
          }
        }
      }
    }
    else {
      if ((puVar3 == (uint *)0x0) || (puVar3[iVar9 * -0x55555555] == 0)) {
        __assert_fail("Gia_ObjIsMux(p,pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x210,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar1 = pObj + -(ulong)(uVar5 & 0x1fffffff);
      if ((pGVar10 <= pGVar1) && (pGVar1 < pGVar4)) {
        uVar6 = (int)((long)pGVar1 - (long)pGVar10 >> 2) * -0x55555555;
        pVVar11 = p->vLevels;
        Vec_IntFillExtra(pVVar11,uVar6 + 1,(uVar5 & 0x1fffffff) * -3);
        if (((int)uVar6 < 0) || (pVVar11->nSize <= (int)uVar6)) {
LAB_0073e5f2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pGVar10 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
        pGVar4 = p->pObjs;
        if ((pGVar4 <= pGVar10) && (pGVar10 < pGVar4 + p->nObjs)) {
          iVar9 = pVVar11->pArray[uVar6 & 0x7fffffff];
          uVar5 = (int)((long)pGVar10 - (long)pGVar4 >> 2) * -0x55555555;
          pVVar11 = p->vLevels;
          Vec_IntFillExtra(pVVar11,uVar5 + 1,Fill);
          if (((int)uVar5 < 0) || (pVVar11->nSize <= (int)uVar5)) goto LAB_0073e5f2;
          iVar12 = pVVar11->pArray[uVar5 & 0x7fffffff];
          if (p->pMuxes == (uint *)0x0) {
            pGVar10 = (Gia_Obj_t *)0x0;
            uVar5 = 0;
          }
          else {
            pGVar10 = p->pObjs;
            if ((pObj < pGVar10) || (pGVar10 + p->nObjs <= pObj)) goto LAB_0073e5d3;
            uVar5 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar10) >> 2) * -0x55555555];
            if ((int)uVar5 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            uVar5 = uVar5 >> 1;
            if (p->nObjs <= (int)uVar5) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar10 = pGVar10 + uVar5;
          }
          pGVar4 = p->pObjs;
          if ((pGVar4 <= pGVar10) && (pGVar10 < pGVar4 + p->nObjs)) {
            uVar6 = (int)((long)pGVar10 - (long)pGVar4 >> 2) * -0x55555555;
            pVVar11 = p->vLevels;
            Vec_IntFillExtra(pVVar11,uVar6 + 1,uVar5);
            if (((int)uVar6 < 0) || (pVVar11->nSize <= (int)uVar6)) goto LAB_0073e5f2;
            pGVar10 = p->pObjs;
            if ((pGVar10 <= pObj) && (pObj < pGVar10 + p->nObjs)) {
              iVar2 = pVVar11->pArray[uVar6 & 0x7fffffff];
              uVar5 = (int)((long)pObj - (long)pGVar10 >> 2) * -0x55555555;
              pVVar11 = p->vLevels;
              Vec_IntFillExtra(pVVar11,uVar5 + 1,Fill_04);
              if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar11->nSize)) {
                if (iVar12 < iVar9) {
                  iVar12 = iVar9;
                }
                if (iVar12 <= iVar2) {
                  iVar12 = iVar2;
                }
                pVVar11->pArray[uVar5 & 0x7fffffff] = iVar12 + 2;
                return;
              }
              goto LAB_0073e611;
            }
          }
        }
      }
    }
  }
LAB_0073e5d3:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }